

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O3

int nni_stat_snapshot(nni_stat **statp,nni_stat_item *item)

{
  int iVar1;
  nni_stat_item *item_00;
  nni_stat *local_38;
  nni_stat *stat;
  nni_mtx *mtx;
  
  stat = (nni_stat *)0x0;
  item_00 = &stats_root;
  if (item != (nni_stat_item *)0x0) {
    item_00 = item;
  }
  nni_mtx_lock(&stats_lock);
  iVar1 = stat_make_tree(item_00,&local_38);
  if (iVar1 == 0) {
    stat_update_tree(local_38,(nni_mtx **)&stat);
    if (stat != (nni_stat *)0x0) {
      nni_mtx_unlock((nni_mtx *)stat);
    }
    nni_mtx_unlock(&stats_lock);
    *statp = local_38;
  }
  else {
    nni_mtx_unlock(&stats_lock);
  }
  return iVar1;
}

Assistant:

int
nni_stat_snapshot(nni_stat **statp, nni_stat_item *item)
{
	int       rv;
	nni_stat *stat;
	nni_mtx  *mtx = NULL;

	if (item == NULL) {
		item = &stats_root;
	}
	nni_mtx_lock(&stats_lock);
	if ((rv = stat_make_tree(item, &stat)) != 0) {
		nni_mtx_unlock(&stats_lock);
		return (rv);
	}
	stat_update_tree(stat, &mtx);
	if (mtx != NULL) {
		nni_mtx_unlock(mtx);
	}
	nni_mtx_unlock(&stats_lock);
	*statp = stat;
	return (0);
}